

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCastToUUID::Operation<duckdb::string_t,duckdb::hugeint_t>
          (TryCastToUUID *this,string_t input,hugeint_t *result,Vector *result_vector,
          CastParameters *parameters)

{
  bool bVar1;
  long lVar2;
  string local_50;
  undefined8 local_30;
  long local_28;
  
  local_28 = input.value._0_8_;
  lVar2 = local_28;
  if ((uint)this < 0xd) {
    lVar2 = (long)&local_30 + 4;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_30 = this;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,lVar2,((ulong)this & 0xffffffff) + lVar2);
  bVar1 = BaseUUID::FromString(&local_50,input.value._8_8_,(bool)(result_vector->type).id_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool TryCastToUUID::Operation(string_t input, hugeint_t &result, Vector &result_vector, CastParameters &parameters) {
	return UUID::FromString(input.GetString(), result, parameters.strict);
}